

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O0

void __thiscall
btCollisionWorld::rayTest
          (btCollisionWorld *this,btVector3 *rayFromWorld,btVector3 *rayToWorld,
          RayResultCallback *resultCallback)

{
  long *plVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  btSingleRayCallback rayCB;
  btScalar local_150;
  btScalar local_14c;
  btScalar local_148;
  btVector3 local_144 [2];
  btScalar local_124;
  btScalar local_120;
  btScalar local_11c;
  btVector3 local_118;
  undefined1 local_108 [152];
  RayResultCallback *in_stack_ffffffffffffff90;
  btCollisionWorld *in_stack_ffffffffffffff98;
  btVector3 *in_stack_ffffffffffffffa0;
  btVector3 *in_stack_ffffffffffffffa8;
  btSingleRayCallback *in_stack_ffffffffffffffb0;
  
  btSingleRayCallback::btSingleRayCallback
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  plVar1 = *(long **)(in_RDI + 0x60);
  local_11c = 0.0;
  local_120 = 0.0;
  local_124 = 0.0;
  btVector3::btVector3(&local_118,&local_11c,&local_120,&local_124);
  local_148 = 0.0;
  local_14c = 0.0;
  local_150 = 0.0;
  btVector3::btVector3(local_144,&local_148,&local_14c,&local_150);
  (**(code **)(*plVar1 + 0x30))(plVar1,in_RSI,in_RDX,local_108,&local_118,local_144);
  btSingleRayCallback::~btSingleRayCallback((btSingleRayCallback *)0x17c907);
  return;
}

Assistant:

void	btCollisionWorld::rayTest(const btVector3& rayFromWorld, const btVector3& rayToWorld, RayResultCallback& resultCallback) const
{
	//BT_PROFILE("rayTest");
	/// use the broadphase to accelerate the search for objects, based on their aabb
	/// and for each object with ray-aabb overlap, perform an exact ray test
	btSingleRayCallback rayCB(rayFromWorld,rayToWorld,this,resultCallback);

#ifndef USE_BRUTEFORCE_RAYBROADPHASE
	m_broadphasePairCache->rayTest(rayFromWorld,rayToWorld,rayCB);
#else
	for (int i=0;i<this->getNumCollisionObjects();i++)
	{
		rayCB.process(m_collisionObjects[i]->getBroadphaseHandle());
	}	
#endif //USE_BRUTEFORCE_RAYBROADPHASE

}